

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

void test_compare_uint(uint64_t a,uint64_t b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_234;
  int r;
  int bi;
  int ai;
  int count_b;
  char mp_nums_b [16] [16];
  char local_118 [4];
  int count_a;
  char mp_nums_a [16] [16];
  uint64_t b_local;
  uint64_t a_local;
  
  mp_nums_a[0xf]._8_8_ = b;
  iVar1 = test_encode_uint_all_sizes((char (*) [16])local_118,a);
  iVar2 = test_encode_uint_all_sizes((char (*) [16])&ai,mp_nums_a[0xf]._8_8_);
  for (r = 0; r < iVar1; r = r + 1) {
    for (local_234 = 0; local_234 < iVar2; local_234 = local_234 + 1) {
      iVar3 = mp_compare_uint(local_118 + (long)r * 0x10,(char *)(&ai + (long)local_234 * 4));
      if (a < (ulong)mp_nums_a[0xf]._8_8_) {
        _ok((uint)(iVar3 < 0),"r < 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x373,"mp_compare_uint(%lu, %lu) < 0",a,mp_nums_a[0xf]._8_8_);
      }
      else if ((ulong)mp_nums_a[0xf]._8_8_ < a) {
        _ok((uint)(0 < iVar3),"r > 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x376,"mp_compare_uint(%lu, %lu) > 0",a,mp_nums_a[0xf]._8_8_);
      }
      else {
        _ok((uint)(iVar3 == 0),"r == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x379,"mp_compare_uint(%lu, %lu) == 0",a,mp_nums_a[0xf]._8_8_);
      }
    }
  }
  return;
}

Assistant:

static void
test_compare_uint(uint64_t a, uint64_t b)
{
	char mp_nums_a[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count_a = test_encode_uint_all_sizes(mp_nums_a, a);

	char mp_nums_b[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count_b = test_encode_uint_all_sizes(mp_nums_b, b);

	for (int ai = 0; ai < count_a; ++ai) {
		for (int bi = 0; bi < count_b; ++bi) {
			int r = mp_compare_uint(mp_nums_a[ai], mp_nums_b[bi]);
			if (a < b) {
				ok(r < 0, "mp_compare_uint(%" PRIu64 ", "
				   "%" PRIu64 ") < 0", a, b);
			} else if (a > b) {
				ok(r > 0, "mp_compare_uint(%" PRIu64 ", "
				   "%" PRIu64 ") > 0", a, b);
			} else {
				ok(r == 0, "mp_compare_uint(%" PRIu64 ", "
				   "%" PRIu64 ") == 0", a, b);
			}
		}
	}
}